

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::DtlsSession::TryWrite(Error *__return_storage_ptr__,DtlsSession *this)

{
  bool bVar1;
  Error *aError;
  byte local_82;
  ErrorCode local_64;
  Error local_60;
  reference local_38;
  value_type *messagePair;
  ErrorCode local_20;
  undefined1 local_19;
  DtlsSession *local_18;
  DtlsSession *this_local;
  Error *error;
  
  local_19 = 0;
  local_18 = this;
  this_local = (DtlsSession *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  while( true ) {
    local_20 = kNone;
    bVar1 = commissioner::operator==(__return_storage_ptr__,&local_20);
    local_82 = 0;
    if (bVar1) {
      bVar1 = std::
              queue<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::deque<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>_>
              ::empty(&this->mSendQueue);
      local_82 = bVar1 ^ 0xff;
    }
    if ((local_82 & 1) == 0) break;
    local_38 = std::
               queue<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::deque<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>_>
               ::front(&this->mSendQueue);
    Write(&local_60,this,&local_38->first,local_38->second);
    aError = Error::operator=(__return_storage_ptr__,&local_60);
    local_64 = kNone;
    bVar1 = commissioner::operator!=(aError,&local_64);
    Error::~Error(&local_60);
    if (bVar1) {
      return __return_storage_ptr__;
    }
    std::
    queue<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::deque<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>_>
    ::pop(&this->mSendQueue);
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::TryWrite()
{
    Error error;
    while (error == ErrorCode::kNone && !mSendQueue.empty())
    {
        auto &messagePair = mSendQueue.front();

        SuccessOrExit(error = Write(messagePair.first, messagePair.second));
        mSendQueue.pop();
    }

exit:
    return error;
}